

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_store_string(char **dest,char *src)

{
  char *pcVar1;
  char *in_RSI;
  long *in_RDI;
  size_t n;
  undefined8 local_18;
  
  local_18 = strlen(in_RSI);
  if (0xfffe < local_18) {
    local_18 = 0xfffe;
    mcpl_error((char *)0x1015ca);
  }
  if (*in_RDI != 0) {
    free((void *)*in_RDI);
  }
  pcVar1 = mcpl_internal_malloc((size_t)in_RSI);
  *in_RDI = (long)pcVar1;
  memcpy((void *)*in_RDI,in_RSI,local_18);
  *(undefined1 *)(*in_RDI + local_18) = 0;
  return;
}

Assistant:

MCPL_LOCAL void mcpl_store_string(char** dest, const char * src)
{
  size_t n = strlen(src);
  if (n>65534) {
    n = 65534;
    mcpl_error("string length out of range");
  }
  if (*dest)
    free(*dest);
  *dest = mcpl_internal_malloc(n+1);

  //Usage of strncpy cause compiler warning on newer gcc, so we use memcpy
  //instead (should be safe, we just checked strlen above!):
  //strncpy( *dest,src,n );
  memcpy( *dest,src,n );
  (*dest)[n] = '\0';
  return;
}